

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::RegisterDebugThunk(ScriptContext *this,bool calledDuringAttach)

{
  if (DAT_0143bfad == '\x01') {
    this->CurrentThunk = DebugProfileProbeThunk;
    this->CurrentCrossSiteThunk = CrossSite::ProfileThunk;
    SetProfileModeNativeCodeGen(this->nativeCodeGen,1);
    JavascriptLibrary::SetProfileMode((this->super_ScriptContextBase).javascriptLibrary,true);
    JavascriptLibrary::SetDispatchProfile
              ((this->super_ScriptContextBase).javascriptLibrary,true,this->DispatchProfileInvoke);
    if (!calledDuringAttach) {
      SetFunctionInRecyclerToProfileMode(this,true);
      return;
    }
  }
  return;
}

Assistant:

void ScriptContext::RegisterDebugThunk(bool calledDuringAttach /*= true*/)
    {
        if (this->IsExceptionWrapperForBuiltInsEnabled())
        {
            this->CurrentThunk = ProfileEntryThunk;
            this->CurrentCrossSiteThunk = CrossSite::ProfileThunk;
#if ENABLE_NATIVE_CODEGEN
            SetProfileModeNativeCodeGen(this->GetNativeCodeGenerator(), TRUE);
#endif

            // Set library to profile mode so that for built-ins all new instances of functions
            // are created with entry point set to the ProfileThunk.
            this->javascriptLibrary->SetProfileMode(true);
            this->javascriptLibrary->SetDispatchProfile(true, DispatchProfileInvoke);

            if (!calledDuringAttach)
            {
#ifdef ENABLE_SCRIPT_PROFILING
                m_fTraceDomCall = TRUE; // This flag is always needed in DebugMode to wrap external functions with DebugProfileThunk
#endif
                // Update the function objects currently present in there.
                this->SetFunctionInRecyclerToProfileMode(true/*enumerateNonUserFunctionsOnly*/);
            }
        }
    }